

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineWriter.cpp
# Opt level: O2

void __thiscall adios2::core::engine::InlineWriter::EndStep(InlineWriter *this)

{
  int iVar1;
  ostream *poVar2;
  allocator local_94;
  allocator local_93;
  allocator local_92;
  allocator local_91;
  ScopedTimer __var2157;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  if (EndStep()::__var157 == '\0') {
    iVar1 = __cxa_guard_acquire(&EndStep()::__var157);
    if (iVar1 != 0) {
      EndStep::__var157 = (void *)ps_timer_create_("InlineWriter::EndStep");
      __cxa_guard_release(&EndStep()::__var157);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer(&__var2157,EndStep::__var157);
  if (this->m_InsideStep == false) {
    std::__cxx11::string::string((string *)&local_28,"Engine",&local_91);
    std::__cxx11::string::string((string *)&local_48,"InlineWriter",&local_92);
    std::__cxx11::string::string((string *)&local_68,"EndStep",&local_93);
    std::__cxx11::string::string
              ((string *)&local_88,
               "InlineWriter::EndStep() cannot be called without a call to BeginStep() first",
               &local_94);
    helper::Throw<std::runtime_error>(&local_28,&local_48,&local_68,&local_88,-1);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_28);
  }
  if (this->m_Verbosity == 5) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Inline Writer ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_WriterRank);
    poVar2 = std::operator<<(poVar2," EndStep() Step ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  this->m_InsideStep = false;
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var2157);
  return;
}

Assistant:

void InlineWriter::EndStep()
{
    PERFSTUBS_SCOPED_TIMER("InlineWriter::EndStep");
    if (!m_InsideStep)
    {
        helper::Throw<std::runtime_error>("Engine", "InlineWriter", "EndStep",
                                          "InlineWriter::EndStep() cannot be called "
                                          "without a call to BeginStep() first");
    }
    if (m_Verbosity == 5)
    {
        std::cout << "Inline Writer " << m_WriterRank << " EndStep() Step " << m_CurrentStep
                  << std::endl;
    }
    m_InsideStep = false;
}